

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O3

int ffi_index_meta(lua_State *L,CTState *cts,CType *ct,MMS mm)

{
  uint uVar1;
  TValue *pTVar2;
  int iVar3;
  cTValue *pcVar4;
  TValue *pTVar5;
  GCstr *pGVar6;
  GCstr *pGVar7;
  ulong uVar8;
  ErrMsg em;
  CTypeID id;
  
  id = (CTypeID)((ulong)((long)ct - (long)cts->tab) >> 4);
  pcVar4 = lj_ctype_meta(cts,id,mm);
  if (pcVar4 != (cTValue *)0x0) {
    if ((pcVar4->field_2).it == 0xfffffff7) goto LAB_00126342;
    pTVar2 = L->base;
    if (mm == MM_index) {
      pcVar4 = lj_meta_tget(L,pcVar4,pTVar2 + 1);
      if (pcVar4 != (cTValue *)0x0) {
        if ((pcVar4->field_2).it != 0xffffffff) {
          L->top[-1] = *pcVar4;
          return 1;
        }
        goto LAB_00126354;
      }
    }
    else {
      pTVar5 = lj_meta_tset(L,pcVar4,pTVar2 + 1);
      if (pTVar5 != (TValue *)0x0) {
        *pTVar5 = pTVar2[2];
        return 0;
      }
    }
    *pTVar2 = *L->top;
    pcVar4 = L->top + -1;
LAB_00126342:
    iVar3 = lj_meta_tailcall(L,pcVar4);
    return iVar3;
  }
LAB_00126354:
  pGVar6 = lj_ctype_repr(L,id,(GCstr *)0x0);
  pTVar2 = L->base;
  uVar1 = *(uint *)((long)pTVar2 + 0xc);
  if (uVar1 == 0xfffffff5) {
    pGVar7 = lj_ctype_repr(L,(uint)*(ushort *)((ulong)pTVar2[1].u32.lo + 6),(GCstr *)0x0);
    pGVar7 = pGVar7 + 1;
  }
  else {
    if (uVar1 == 0xfffffffb) {
      pGVar7 = (GCstr *)((ulong)pTVar2[1].u32.lo + 0x10);
      em = LJ_ERR_FFI_BADMEMBER;
      goto LAB_001263dd;
    }
    uVar8 = 0xd;
    if ((0xfffeffff < uVar1) && (uVar8 = 3, (uVar1 & 0xffff8000) != 0xffff0000)) {
      uVar8 = (ulong)~uVar1;
    }
    pGVar7 = (GCstr *)lj_obj_itypename[uVar8];
  }
  em = LJ_ERR_FFI_BADIDXW;
LAB_001263dd:
  lj_err_callerv(L,em,pGVar6 + 1,pGVar7);
}

Assistant:

static int ffi_index_meta(lua_State *L, CTState *cts, CType *ct, MMS mm)
{
  CTypeID id = ctype_typeid(cts, ct);
  cTValue *tv = lj_ctype_meta(cts, id, mm);
  TValue *base = L->base;
  if (!tv) {
    const char *s;
  err_index:
    s = strdata(lj_ctype_repr(L, id, NULL));
    if (tvisstr(L->base+1)) {
      lj_err_callerv(L, LJ_ERR_FFI_BADMEMBER, s, strVdata(L->base+1));
    } else {
      const char *key = tviscdata(L->base+1) ?
	strdata(lj_ctype_repr(L, cdataV(L->base+1)->ctypeid, NULL)) :
	lj_typename(L->base+1);
      lj_err_callerv(L, LJ_ERR_FFI_BADIDXW, s, key);
    }
  }
  if (!tvisfunc(tv)) {
    if (mm == MM_index) {
      cTValue *o = lj_meta_tget(L, tv, base+1);
      if (o) {
	if (tvisnil(o)) goto err_index;
	copyTV(L, L->top-1, o);
	return 1;
      }
    } else {
      TValue *o = lj_meta_tset(L, tv, base+1);
      if (o) {
	copyTV(L, o, base+2);
	return 0;
      }
    }
    copyTV(L, base, L->top);
    tv = L->top-1-LJ_FR2;
  }
  return lj_meta_tailcall(L, tv);
}